

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructPackDecl_ObjectAPI
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          *array_lengths)

{
  FieldDef *pFVar1;
  StructDef *pSVar2;
  EnumDef *pEVar3;
  undefined8 uVar4;
  pointer ppFVar5;
  pointer pFVar6;
  pointer pFVar7;
  string *this_00;
  size_t i;
  ulong uVar8;
  unsigned_long t;
  size_t i_2;
  long lVar9;
  vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
  array_only_lengths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  CSharpGenerator *local_1d0;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> idx;
  Type local_188;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  FieldArrayLength tmp_array_length;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1d0 = this;
  for (ppFVar5 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar5 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar5 = ppFVar5 + 1) {
    pFVar1 = *ppFVar5;
    if ((pFVar1->value).type.base_type == BASE_TYPE_ARRAY) {
      local_188.fixed_length = (pFVar1->value).type.fixed_length;
      local_188.element = BASE_TYPE_NONE;
      local_188.base_type = (pFVar1->value).type.element;
      pSVar2 = (pFVar1->value).type.struct_def;
      pEVar3 = (pFVar1->value).type.enum_def;
      local_188.struct_def._0_2_ = SUB82(pSVar2,0);
      local_188.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
      local_188.enum_def._0_2_ = SUB82(pEVar3,0);
      local_188.enum_def._2_6_ = (undefined6)((ulong)pEVar3 >> 0x10);
    }
    else {
      local_188.base_type = (pFVar1->value).type.base_type;
      local_188.element = (pFVar1->value).type.element;
      pSVar2 = (pFVar1->value).type.struct_def;
      uVar4 = *(undefined8 *)((long)&(pFVar1->value).type.enum_def + 2);
      local_188.enum_def._0_2_ =
           (undefined2)((ulong)*(undefined8 *)((long)&(pFVar1->value).type.struct_def + 2) >> 0x30);
      local_188.enum_def._2_6_ = (undefined6)uVar4;
      local_188.fixed_length = (uint16_t)((ulong)uVar4 >> 0x30);
      local_188.struct_def._0_2_ = SUB82(pSVar2,0);
      local_188.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
    }
    std::__cxx11::string::string((string *)&tmp_array_length,(string *)pFVar1);
    tmp_array_length.length = (int)local_188.fixed_length;
    std::
    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
    ::push_back(array_lengths,&tmp_array_length);
    if ((StructDef *)CONCAT62(local_188.struct_def._2_6_,local_188.struct_def._0_2_) ==
        (StructDef *)0x0) {
      array_only_lengths.
      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      array_only_lengths.
      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      array_only_lengths.
      super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar9 = 0;
      uVar8 = 0;
      while( true ) {
        pFVar6 = (array_lengths->
                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pFVar7 = (array_lengths->
                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)(((long)pFVar7 - (long)pFVar6) / 0x28) <= uVar8) break;
        if (0 < *(int *)((long)&pFVar6->length + lVar9)) {
          std::
          vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ::push_back(&array_only_lengths,
                      (value_type *)((long)&(pFVar6->name)._M_dataplus._M_p + lVar9));
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x28;
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      lVar9 = 0;
      for (uVar8 = 0; uVar8 < (ulong)(((long)pFVar7 - (long)pFVar6) / 0x28); uVar8 = uVar8 + 1) {
        std::operator+(&idx,"_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(pFVar6->name)._M_dataplus._M_p + lVar9));
        std::__cxx11::string::append((string *)&name);
        std::__cxx11::string::~string((string *)&idx);
        pFVar6 = (array_lengths->
                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pFVar7 = (array_lengths->
                 super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar9 = lVar9 + 0x28;
      }
      std::operator+(&local_1f0,"    var ",&name);
      std::operator+(&idx,&local_1f0," = ");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&idx);
      std::__cxx11::string::~string((string *)&local_1f0);
      if (array_only_lengths.
          super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          array_only_lengths.
          super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)code_ptr);
        lVar9 = 0;
        for (uVar8 = 0;
            pFVar6 = (array_lengths->
                     super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)(((long)(array_lengths->
                                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar6) /
                           0x28); uVar8 = uVar8 + 1) {
          ConvertCase(&local_1f0,(string *)((long)&(pFVar6->name)._M_dataplus._M_p + lVar9),
                      kUpperCamel,kSnake);
          std::operator+(&idx,".",&local_1f0);
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&idx);
          std::__cxx11::string::~string((string *)&local_1f0);
          lVar9 = lVar9 + 0x28;
        }
        std::__cxx11::string::append((char *)code_ptr);
      }
      else {
        GenTypeBasic_abi_cxx11_(&local_1c8,local_1d0,&local_188);
        std::operator+(&local_1f0,"new ",&local_1c8);
        std::operator+(&idx,&local_1f0,"[");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&idx);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1c8);
        lVar9 = 0x20;
        for (uVar8 = 0;
            uVar8 < (ulong)(((long)array_only_lengths.
                                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)array_only_lengths.
                                  super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x28);
            uVar8 = uVar8 + 1) {
          if (uVar8 != 0) {
            std::__cxx11::string::append((char *)code_ptr);
          }
          NumToString<int>(&idx,*(int *)((long)&((array_only_lengths.
                                                  super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->name).
                                                _M_dataplus._M_p + lVar9));
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&idx);
          lVar9 = lVar9 + 0x28;
        }
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
        lVar9 = 0x20;
        uVar8 = 0;
        while( true ) {
          if ((ulong)(((long)array_only_lengths.
                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)array_only_lengths.
                            super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar8) break;
          NumToString<unsigned_long>(&local_1f0,uVar8);
          std::operator+(&idx,"idx",&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::operator+(&local_d0,"for (var ",&idx);
          std::operator+(&local_b0,&local_d0," = 0; ");
          std::operator+(&local_90,&local_b0,&idx);
          std::operator+(&local_138,&local_90," < ");
          NumToString<int>(&local_f0,
                           *(int *)((long)&((array_only_lengths.
                                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->name).
                                           _M_dataplus._M_p + lVar9));
          std::operator+(&local_70,&local_138,&local_f0);
          std::operator+(&local_50,&local_70,"; ++");
          std::operator+(&local_1c8,&local_50,&idx);
          std::operator+(&local_1f0,&local_1c8,") {");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&idx);
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x28;
        }
        for (uVar8 = 0;
            uVar8 < (ulong)(((long)array_only_lengths.
                                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)array_only_lengths.
                                  super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x28);
            uVar8 = uVar8 + 1) {
          NumToString<unsigned_long>(&local_1f0,uVar8);
          std::operator+(&idx,"idx",&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          if (uVar8 == 0) {
            std::operator+(&local_1c8,&name,"[");
            std::operator+(&local_1f0,&local_1c8,&idx);
            std::__cxx11::string::append((string *)code_ptr);
            std::__cxx11::string::~string((string *)&local_1f0);
            this_00 = &local_1c8;
          }
          else {
            std::operator+(&local_1f0,",",&idx);
            std::__cxx11::string::append((string *)code_ptr);
            this_00 = &local_1f0;
          }
          std::__cxx11::string::~string((string *)this_00);
          std::__cxx11::string::~string((string *)&idx);
        }
        std::__cxx11::string::append((char *)code_ptr);
        lVar9 = 0;
        uVar8 = 0;
        t = 0;
        while( true ) {
          pFVar6 = (array_lengths->
                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(array_lengths->
                             super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar6) / 0x28) <=
              uVar8) break;
          ConvertCase(&local_1f0,(string *)((long)&(pFVar6->name)._M_dataplus._M_p + lVar9),
                      kUpperCamel,kSnake);
          std::operator+(&idx,".",&local_1f0);
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&idx);
          std::__cxx11::string::~string((string *)&local_1f0);
          if (0 < *(int *)((long)&((array_lengths->
                                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->length + lVar9)) {
            NumToString<unsigned_long>(&local_1c8,t);
            std::operator+(&local_1f0,"[idx",&local_1c8);
            std::operator+(&idx,&local_1f0,"]");
            std::__cxx11::string::append((string *)code_ptr);
            t = t + 1;
            std::__cxx11::string::~string((string *)&idx);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::__cxx11::string::~string((string *)&local_1c8);
          }
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x28;
        }
        std::__cxx11::string::append((char *)code_ptr);
        for (uVar8 = 0;
            uVar8 < (ulong)(((long)array_only_lengths.
                                   super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)array_only_lengths.
                                  super__Vector_base<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x28);
            uVar8 = uVar8 + 1) {
          std::__cxx11::string::append((char *)code_ptr);
        }
      }
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::~string((string *)&name);
      std::
      vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
      ::~vector(&array_only_lengths);
    }
    else {
      GenStructPackDecl_ObjectAPI
                (local_1d0,
                 (StructDef *)CONCAT62(local_188.struct_def._2_6_,local_188.struct_def._0_2_),
                 code_ptr,array_lengths);
    }
    std::
    vector<flatbuffers::csharp::CSharpGenerator::FieldArrayLength,_std::allocator<flatbuffers::csharp::CSharpGenerator::FieldArrayLength>_>
    ::pop_back(array_lengths);
    std::__cxx11::string::~string((string *)&tmp_array_length);
  }
  return;
}

Assistant:

void GenStructPackDecl_ObjectAPI(
      const StructDef &struct_def, std::string *code_ptr,
      std::vector<FieldArrayLength> &array_lengths) const {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      auto is_array = IsArray(field.value.type);
      const auto &field_type =
          is_array ? field.value.type.VectorType() : field.value.type;
      FieldArrayLength tmp_array_length = {
        field.name,
        field_type.fixed_length,
      };
      array_lengths.push_back(tmp_array_length);
      if (field_type.struct_def != nullptr) {
        GenStructPackDecl_ObjectAPI(*field_type.struct_def, code_ptr,
                                    array_lengths);
      } else {
        std::vector<FieldArrayLength> array_only_lengths;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          if (array_lengths[i].length > 0) {
            array_only_lengths.push_back(array_lengths[i]);
          }
        }
        std::string name;
        for (size_t i = 0; i < array_lengths.size(); ++i) {
          name += "_" + array_lengths[i].name;
        }
        code += "    var " + name + " = ";
        if (array_only_lengths.size() > 0) {
          code += "new " + GenTypeBasic(field_type) + "[";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            if (i != 0) { code += ","; }
            code += NumToString(array_only_lengths[i].length);
          }
          code += "];\n";
          code += "    ";
          // initialize array
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            code += "for (var " + idx + " = 0; " + idx + " < " +
                    NumToString(array_only_lengths[i].length) + "; ++" + idx +
                    ") {";
          }
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            auto idx = "idx" + NumToString(i);
            if (i == 0) {
              code += name + "[" + idx;
            } else {
              code += "," + idx;
            }
          }
          code += "] = _o";
          for (size_t i = 0, j = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
            if (array_lengths[i].length <= 0) continue;
            code += "[idx" + NumToString(j++) + "]";
          }
          code += ";";
          for (size_t i = 0; i < array_only_lengths.size(); ++i) {
            code += "}";
          }
        } else {
          code += "_o";
          for (size_t i = 0; i < array_lengths.size(); ++i) {
            code += "." + ConvertCase(array_lengths[i].name, Case::kUpperCamel);
          }
          code += ";";
        }
        code += "\n";
      }
      array_lengths.pop_back();
    }
  }